

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

shared_ptr<cxxopts::Value> __thiscall
cxxopts::value<std::__cxx11::string>
          (cxxopts *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cxxopts::Value> sVar1;
  standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  undefined8 *puStack_30;
  
  local_38 = (standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  puStack_30 = (undefined8 *)operator_new(0x88);
  puStack_30[1] = 0x100000001;
  *puStack_30 = &PTR___Sp_counted_ptr_inplace_0013b450;
  local_38 = (standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(puStack_30 + 2);
  puStack_30[3] = 0;
  puStack_30[4] = 0;
  puStack_30[5] = 0;
  puStack_30[6] = 0;
  puStack_30[7] = t;
  *(undefined2 *)(puStack_30 + 8) = 0;
  puStack_30[9] = puStack_30 + 0xb;
  puStack_30[10] = 0;
  *(undefined1 *)(puStack_30 + 0xb) = 0;
  puStack_30[0xd] = puStack_30 + 0xf;
  puStack_30[0xe] = 0;
  *(undefined1 *)(puStack_30 + 0xf) = 0;
  puStack_30[2] = &PTR__abstract_value_0013b4a0;
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cxxopts::values::standard_value<std::__cxx11::string>,cxxopts::values::standard_value<std::__cxx11::string>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_38,local_38);
  *(undefined8 *)(this + 8) = 0;
  *(standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    **)this = local_38;
  *(undefined8 **)(this + 8) = puStack_30;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
    value(T& t)
    {
        return std::make_shared<values::standard_value<T>>(&t);
    }